

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent_Test
::
~Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent_Test
          (Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent_Test
           *this)

{
  Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent_Test
  *this_local;
  
  ~Units_flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent_Test
            (this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, flattenImportedUnitsWithNonStandardReferenceDirectlyWithExistingNonEquivalentUnitsThroughComponent)
{
    libcellml::ModelPtr importModel;
    libcellml::ImporterPtr importer = libcellml::Importer::create();
    libcellml::ImportSourcePtr import = createBaseModelImport(importModel, "importer/units/base_model.cellml");

    libcellml::ModelPtr model = libcellml::Model::create("main_model");

    libcellml::ComponentPtr ic = libcellml::Component::create("my_component");
    ic->setImportSource(import);
    ic->setImportReference("my_component");

    libcellml::UnitsPtr u = libcellml::Units::create("fmol");
    u->addUnit("farad");
    u->addUnit("mole");

    model->addComponent(ic);
    model->addUnits(u);

    auto flatModel = importer->flattenModel(model);

    EXPECT_EQ(size_t(3), flatModel->unitsCount());
    EXPECT_EQ("fmol", flatModel->units(0)->name());
    EXPECT_EQ("fmol_1", flatModel->units(1)->name());
    EXPECT_EQ("per_fmol", flatModel->units(2)->name());
    EXPECT_EQ("fmol_1", flatModel->units(2)->unitAttributeReference(0));
    EXPECT_EQ("per_fmol", flatModel->component(0)->variable(0)->units()->name());
}